

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execMul<(moira::Instr)81,(moira::Mode)2,(moira::Size)2>(Moira *this,u16 opcode)

{
  bool bVar1;
  uint n;
  uint uVar2;
  ushort in_SI;
  u32 *in_RDI;
  int dst;
  int src;
  u32 result;
  u32 data;
  u32 ea;
  u32 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  n = in_SI & 7;
  uVar2 = (int)(uint)in_SI >> 9 & 7;
  bVar1 = readOp<(moira::Mode)2,(moira::Size)2,0ul>
                    ((Moira *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),n,in_RDI
                     ,(u32 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (bVar1) {
    prefetch<4ul>((Moira *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    readD<(moira::Size)2>
              ((Moira *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
    mul<(moira::Instr)81>((Moira *)CONCAT44(n,uVar2),(u32)((ulong)in_RDI >> 0x20),(u32)in_RDI);
    writeD<(moira::Size)4>
              ((Moira *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void
Moira::execMul(u16 opcode)
{
    if (MIMIC_MUSASHI) {
        execMulMusashi<I, M, S>(opcode);
        return;
    }

    u32 ea, data, result;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp <M,Word, STD_AE_FRAME> (src, ea, data)) return;

    prefetch<POLLIPL>();
    result = mul<I>(data, readD<Word>(dst));
    
    writeD(dst, result);
}